

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O3

void __thiscall xray_re::se_smart_cover::state_write(se_smart_cover *this)

{
  xr_packet *in_RSI;
  
  state_write((se_smart_cover *)&this[-1].m_last_description.field_2,in_RSI);
  return;
}

Assistant:

void se_smart_cover::state_write(xr_packet& packet)
{
	cse_smart_cover::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		packet.w_sz(m_last_description);
		packet.w_u8(m_loopholes_count);

		if (m_loopholes_count > 0)
		{
			for (std::vector<loophole>::iterator it = m_loopholes->begin(), end = m_loopholes->end();
				it != end; ++it){
				packet.w_sz(it->id);
				packet.w_bool(it->enabled);
			}
		}
	}
}